

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_12,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  Vector<float,_3> *pVVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  Vector<float,_3> *pVVar7;
  int col;
  undefined4 uVar8;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat4x3 m;
  Type in1;
  float afStack_e8 [6];
  float local_d0 [4];
  float local_c0 [2];
  ulong local_b8;
  undefined4 local_b0;
  Matrix<float,_3,_4> local_a8;
  Matrix<float,_4,_4> local_78;
  Matrix<float,_3,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&local_a8;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar8;
        lVar6 = lVar6 + 0xc;
      } while (lVar6 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_a8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_a8.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_a8.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_a8.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_a8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_a8.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_a8.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    local_a8.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar1 = (Vector<float,_3> *)&local_a8;
    local_a8.m_data.m_data[2].m_data[2] = 0.0;
    local_a8.m_data.m_data[3].m_data[0] = 0.0;
    local_a8.m_data.m_data[3].m_data[1] = 0.0;
    local_a8.m_data.m_data[3].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[2] = 0.0;
    local_a8.m_data.m_data[2].m_data[0] = 0.0;
    local_a8.m_data.m_data[2].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    puVar4 = &s_constInMat4x3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pVVar7 = pVVar1;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar7->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar5 != 4);
      lVar3 = lVar3 + 1;
      pVVar1 = (Vector<float,_3> *)(pVVar1->m_data + 1);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&local_78;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar8;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_78.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_78.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_78.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_78.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_78.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_78.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_78.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_78;
    local_78.m_data.m_data[3].m_data[0] = 0.0;
    local_78.m_data.m_data[3].m_data[1] = 0.0;
    local_78.m_data.m_data[3].m_data[2] = 0.0;
    local_78.m_data.m_data[3].m_data[3] = 0.0;
    local_78.m_data.m_data[2].m_data[0] = 0.0;
    local_78.m_data.m_data[2].m_data[1] = 0.0;
    local_78.m_data.m_data[2].m_data[2] = 0.0;
    local_78.m_data.m_data[2].m_data[3] = 0.0;
    local_78.m_data.m_data[1].m_data[0] = 0.0;
    local_78.m_data.m_data[1].m_data[1] = 0.0;
    local_78.m_data.m_data[1].m_data[2] = 0.0;
    local_78.m_data.m_data[1].m_data[3] = 0.0;
    local_78.m_data.m_data[0].m_data[0] = 0.0;
    local_78.m_data.m_data[0].m_data[1] = 0.0;
    local_78.m_data.m_data[0].m_data[2] = 0.0;
    local_78.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &DAT_01beafe0;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = (float)*(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  tcu::operator*(&local_38,&local_a8,&local_78);
  local_d0[2] = 0.0;
  local_d0[0] = 0.0;
  local_d0[1] = 0.0;
  lVar3 = 0;
  do {
    local_d0[lVar3] =
         local_38.m_data.m_data[0].m_data[lVar3] + local_38.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b8 = local_b8 & 0xffffffff00000000;
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  lVar3 = 0;
  do {
    local_c0[lVar3] = local_d0[lVar3] + local_38.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_e8[4] = 0.0;
  afStack_e8[2] = 0.0;
  afStack_e8[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_e8[lVar3 + 2] = local_c0[lVar3] + local_38.m_data.m_data[3].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b8 = 0x100000000;
  local_b0 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_c0[lVar3]] = afStack_e8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}